

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O2

h2o_cache_ref_t *
h2o_cache_fetch(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash)

{
  kh_cache_t *h;
  st_h2o_linklist_t *psVar1;
  st_h2o_linklist_t *psVar2;
  khint_t kVar3;
  ulong uVar4;
  h2o_cache_ref_t *phVar5;
  h2o_cache_ref_t local_88;
  
  if (keyhash == 0) {
    keyhash = h2o_cache_calchash(key.base,key.len);
  }
  local_88.key.base = key.base;
  local_88.key.len = key.len;
  local_88.keyhash = keyhash;
  lock_cache(cache);
  purge(cache,now);
  h = cache->table;
  kVar3 = kh_get_cache(h,&local_88);
  if (kVar3 != h->n_buckets) {
    phVar5 = h->keys[kVar3];
    uVar4 = (phVar5->at - now) + cache->duration;
    if (-1 < (long)uVar4) {
      if (((9 < uVar4) || ((cache->flags & 2U) == 0)) || (phVar5->_requested_early_update != 0)) {
        psVar1 = (phVar5->_lru_link).next;
        psVar2 = (phVar5->_lru_link).prev;
        psVar1->prev = psVar2;
        psVar2->next = psVar1;
        (phVar5->_lru_link).next = (st_h2o_linklist_t *)0x0;
        (phVar5->_lru_link).prev = (st_h2o_linklist_t *)0x0;
        h2o_linklist_insert(&cache->lru,&phVar5->_lru_link);
        LOCK();
        phVar5->_refcnt = phVar5->_refcnt + 1;
        UNLOCK();
        goto LAB_001294b2;
      }
      phVar5->_requested_early_update = 1;
    }
  }
  phVar5 = (h2o_cache_ref_t *)0x0;
LAB_001294b2:
  unlock_cache(cache);
  return phVar5;
}

Assistant:

h2o_cache_ref_t *h2o_cache_fetch(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash)
{
    h2o_cache_ref_t search_key, *ref;
    khiter_t iter;
    int64_t timeleft;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);
    search_key.key = key;
    search_key.keyhash = keyhash;

    lock_cache(cache);

    purge(cache, now);

    if ((iter = kh_get(cache, cache->table, &search_key)) == kh_end(cache->table))
        goto NotFound;

    /* found */
    ref = kh_key(cache->table, iter);
    timeleft = get_timeleft(cache, ref, now);
    if (timeleft < 0)
        goto NotFound;
    if ((cache->flags & H2O_CACHE_FLAG_EARLY_UPDATE) != 0 && timeleft < 10 && !ref->_requested_early_update) {
        ref->_requested_early_update = 1;
        goto NotFound;
    }
    /* move the entry to the top of LRU */
    h2o_linklist_unlink(&ref->_lru_link);
    h2o_linklist_insert(&cache->lru, &ref->_lru_link);
    __sync_fetch_and_add(&ref->_refcnt, 1);

    /* unlock and return the found entry */
    unlock_cache(cache);
    return ref;

NotFound:
    unlock_cache(cache);
    return NULL;
}